

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O2

void __thiscall minibag::Bag::startWritingChunk(Bag *this,Time time)

{
  ChunkedFile *this_00;
  uint64_t uVar1;
  
  this_00 = &this->file_;
  uVar1 = ChunkedFile::getOffset(this_00);
  (this->curr_chunk_info_).pos = uVar1;
  (this->curr_chunk_info_).start_time.super_TimeBase<miniros::Time,_miniros::Duration> =
       time.super_TimeBase<miniros::Time,_miniros::Duration>;
  (this->curr_chunk_info_).end_time.super_TimeBase<miniros::Time,_miniros::Duration> =
       time.super_TimeBase<miniros::Time,_miniros::Duration>;
  writeChunkHeader(this,this->compression_,0,0);
  ChunkedFile::setWriteMode(this_00,this->compression_);
  uVar1 = ChunkedFile::getOffset(this_00);
  this->curr_chunk_data_pos_ = uVar1;
  this->chunk_open_ = true;
  return;
}

Assistant:

void Bag::startWritingChunk(Time time) {
    // Initialize chunk info
    curr_chunk_info_.pos        = file_.getOffset();
    curr_chunk_info_.start_time = time;
    curr_chunk_info_.end_time   = time;

    // Write the chunk header, with a place-holder for the data sizes (we'll fill in when the chunk is finished)
    writeChunkHeader(compression_, 0, 0);

    // Turn on compressed writing
    file_.setWriteMode(compression_);
    
    // Record where the data section of this chunk started
    curr_chunk_data_pos_ = file_.getOffset();

    chunk_open_ = true;
}